

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

float __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,char *name)

{
  double dVar1;
  char *pcVar2;
  SAttribute *pSVar3;
  float fVar4;
  stringc c;
  string<char> local_18;
  
  pSVar3 = getAttributeByName(this,name);
  if (pSVar3 == (SAttribute *)0x0) {
    fVar4 = 0.0;
  }
  else {
    local_18.array = (char *)0x0;
    local_18.allocated = 0;
    local_18.used = 0;
    core::string<char>::operator=(&local_18,(pSVar3->Value).array);
    pcVar2 = local_18.array;
    dVar1 = atof(local_18.array);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    fVar4 = (float)dVar1;
  }
  return fVar4;
}

Assistant:

float getAttributeValueAsFloat(const char_type* name) const
	{
		const SAttribute* attr = getAttributeByName(name);
		if (!attr)
			return 0;

		core::stringc c = attr->Value.c_str();
        return static_cast<float>(atof(c.c_str()));
        //return fast_atof(c.c_str());
	}